

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

string * __thiscall
pbrt::CompensatedFloat::ToString_abi_cxx11_(string *__return_storage_ptr__,CompensatedFloat *this)

{
  float *in_R8;
  
  StringPrintf<float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ CompensatedFloat v: %f err: %f ]",(char *)this,
             &this->err,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string CompensatedFloat::ToString() const {
    return StringPrintf("[ CompensatedFloat v: %f err: %f ]", v, err);
}